

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::Settings::Settings(Settings *this)

{
  int i_2;
  int i_1;
  int i;
  Settings *this_local;
  
  for (i = 0; i < 0x1a; i = i + 1) {
    this->_boolParamValues[i] = (bool)(boolParam[(long)i + 0x680] & 1);
  }
  for (i_1 = 0; i_1 < 0x1c; i_1 = i_1 + 1) {
    this->_intParamValues[i_1] = *(int *)(intParam + (long)i_1 * 4 + 0x700);
  }
  for (i_2 = 0; i_2 < 0x1b; i_2 = i_2 + 1) {
    this->_realParamValues[i_2] = *(Real *)(realParam + (long)i_2 * 8 + 0x6c0);
  }
  return;
}

Assistant:

SoPlexBase<R>::Settings::Settings()
{
   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      _boolParamValues[i] = boolParam.defaultValue[i];

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      _intParamValues[i] = intParam.defaultValue[i];

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      _realParamValues[i] = realParam.defaultValue[i];

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      _rationalParamValues[i] = rationalParam.defaultValue[i];

#endif
}